

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts_engine.c
# Opt level: O1

void usage(void)

{
  fprintf(_stderr,"%s\n",
          "The HMM-Based Speech Synthesis Engine \"hts_engine API\"\nVersion 1.10 (http://hts-engine.sourceforge.net/)\nCopyright (C) 2001-2015 Nagoya Institute of Technology\n              2001-2008 Tokyo Institute of Technology\nAll rights reserved.\n"
         );
  fwrite("hts_engine - The HMM-based speech synthesis engine \"hts_engine API\"\n",0x44,1,_stderr);
  fputc(10,_stderr);
  fwrite("  usage:\n",9,1,_stderr);
  fwrite("    hts_engine [ options ] [ infile ]\n",0x26,1,_stderr);
  fwrite("  options:                                                                   [  def][ min-- max]\n"
         ,0x61,1,_stderr);
  fwrite("    -m  htsvoice   : HTS voice files                                         [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -od s          : filename of output label with duration                  [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -om s          : filename of output spectrum                             [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -of s          : filename of output log F0                               [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -ol s          : filename of output low-pass filter                      [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -or s          : filename of output raw audio (generated speech)         [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -ow s          : filename of output wav audio (generated speech)         [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -ot s          : filename of output trace information                    [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -vp            : use phoneme alignment for duration                      [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -i  i f1 .. fi : enable interpolation & specify number(i),coefficient(f) [  N/A]\n",
         0x55,1,_stderr);
  fwrite("    -s  i          : sampling frequency                                      [ auto][   1--    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -p  i          : frame period (point)                                    [ auto][   1--    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -a  f          : all-pass constant                                       [ auto][ 0.0-- 1.0]\n"
         ,0x61,1,_stderr);
  fwrite("    -b  f          : postfiltering coefficient                               [  0.0][ 0.0-- 1.0]\n"
         ,0x61,1,_stderr);
  fwrite("    -r  f          : speech speed rate                                       [  1.0][ 0.0--    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -fm f          : additional half-tone                                    [  0.0][    --    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -u  f          : voiced/unvoiced threshold                               [  0.5][ 0.0-- 1.0]\n"
         ,0x61,1,_stderr);
  fwrite("    -jm f          : weight of GV for spectrum                               [  1.0][ 0.0--    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -jf f          : weight of GV for log F0                                 [  1.0][ 0.0--    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -g  f          : volume (dB)                                             [  0.0][    --    ]\n"
         ,0x61,1,_stderr);
  fwrite("    -z  i          : audio buffer size (if i==0, turn off)                   [    0][   0--    ]\n"
         ,0x61,1,_stderr);
  fwrite("  infile:\n",10,1,_stderr);
  fwrite("    label file\n",0xf,1,_stderr);
  fwrite("  note:\n",8,1,_stderr);
  fwrite("    generated spectrum, log F0, and low-pass filter coefficient\n",0x40,1,_stderr);
  fwrite("    sequences are saved in natural endian, binary (float) format.\n",0x42,1,_stderr);
  fputc(10,_stderr);
  exit(0);
}

Assistant:

void usage(void)
{
   fprintf(stderr, "%s\n", HTS_COPYRIGHT);
   fprintf(stderr, "hts_engine - The HMM-based speech synthesis engine \"hts_engine API\"\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "  usage:\n");
   fprintf(stderr, "    hts_engine [ options ] [ infile ]\n");
   fprintf(stderr, "  options:                                                                   [  def][ min-- max]\n");
   fprintf(stderr, "    -m  htsvoice   : HTS voice files                                         [  N/A]\n");
   fprintf(stderr, "    -od s          : filename of output label with duration                  [  N/A]\n");
   fprintf(stderr, "    -om s          : filename of output spectrum                             [  N/A]\n");
   fprintf(stderr, "    -of s          : filename of output log F0                               [  N/A]\n");
   fprintf(stderr, "    -ol s          : filename of output low-pass filter                      [  N/A]\n");
   fprintf(stderr, "    -or s          : filename of output raw audio (generated speech)         [  N/A]\n");
   fprintf(stderr, "    -ow s          : filename of output wav audio (generated speech)         [  N/A]\n");
   fprintf(stderr, "    -ot s          : filename of output trace information                    [  N/A]\n");
   fprintf(stderr, "    -vp            : use phoneme alignment for duration                      [  N/A]\n");
   fprintf(stderr, "    -i  i f1 .. fi : enable interpolation & specify number(i),coefficient(f) [  N/A]\n");
   fprintf(stderr, "    -s  i          : sampling frequency                                      [ auto][   1--    ]\n");
   fprintf(stderr, "    -p  i          : frame period (point)                                    [ auto][   1--    ]\n");
   fprintf(stderr, "    -a  f          : all-pass constant                                       [ auto][ 0.0-- 1.0]\n");
   fprintf(stderr, "    -b  f          : postfiltering coefficient                               [  0.0][ 0.0-- 1.0]\n");
   fprintf(stderr, "    -r  f          : speech speed rate                                       [  1.0][ 0.0--    ]\n");
   fprintf(stderr, "    -fm f          : additional half-tone                                    [  0.0][    --    ]\n");
   fprintf(stderr, "    -u  f          : voiced/unvoiced threshold                               [  0.5][ 0.0-- 1.0]\n");
   fprintf(stderr, "    -jm f          : weight of GV for spectrum                               [  1.0][ 0.0--    ]\n");
   fprintf(stderr, "    -jf f          : weight of GV for log F0                                 [  1.0][ 0.0--    ]\n");
   fprintf(stderr, "    -g  f          : volume (dB)                                             [  0.0][    --    ]\n");
   fprintf(stderr, "    -z  i          : audio buffer size (if i==0, turn off)                   [    0][   0--    ]\n");
   fprintf(stderr, "  infile:\n");
   fprintf(stderr, "    label file\n");
   fprintf(stderr, "  note:\n");
   fprintf(stderr, "    generated spectrum, log F0, and low-pass filter coefficient\n");
   fprintf(stderr, "    sequences are saved in natural endian, binary (float) format.\n");
   fprintf(stderr, "\n");

   exit(0);
}